

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

GaussianFilter *
pbrt::GaussianFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  GaussianFilter *pGVar1;
  Float sigma;
  allocator<char> local_41;
  Float local_40;
  Float local_3c;
  Float local_38;
  Float local_34;
  undefined1 local_30 [32];
  polymorphic_allocator<std::byte> local_10;
  
  local_10.memoryResource = alloc.memoryResource;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"xradius",(allocator<char> *)&local_40);
  local_34 = ParameterDictionary::GetOneFloat(parameters,(string *)local_30,1.5);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"yradius",(allocator<char> *)&local_40);
  local_38 = ParameterDictionary::GetOneFloat(parameters,(string *)local_30,1.5);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"sigma",&local_41);
  local_3c = ParameterDictionary::GetOneFloat(parameters,(string *)local_30,0.5);
  std::__cxx11::string::~string((string *)local_30);
  local_30._0_4_ = local_34;
  local_40 = local_3c;
  local_30._4_4_ = local_38;
  pGVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::GaussianFilter,pbrt::Vector2<float>,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&local_10,(Vector2<float> *)local_30,&local_40,&local_10);
  return pGVar1;
}

Assistant:

GaussianFilter *GaussianFilter::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    // Find common filter parameters
    Float xw = parameters.GetOneFloat("xradius", 1.5f);
    Float yw = parameters.GetOneFloat("yradius", 1.5f);
    Float sigma = parameters.GetOneFloat("sigma", 0.5f);  // equivalent to old alpha = 2
    return alloc.new_object<GaussianFilter>(Vector2f(xw, yw), sigma, alloc);
}